

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::ParameterParameter::ParameterParameter(ParameterParameter *this,ParameterParameter *from)

{
  bool bVar1;
  InternalMetadataWithArena *this_00;
  BlobShape *this_01;
  ParameterParameter *from_local;
  ParameterParameter *this_local;
  Container *local_28;
  
  google::protobuf::Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__ParameterParameter_00d4f920;
  google::protobuf::internal::InternalMetadataWithArena::InternalMetadataWithArena
            (&this->_internal_metadata_,(Arena *)0x0);
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_00);
    }
    else {
      local_28 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArena::default_instance();
    }
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,&local_28->unknown_fields);
  }
  bVar1 = has_shape(from);
  if (bVar1) {
    this_01 = (BlobShape *)operator_new(0x30);
    BlobShape::BlobShape(this_01,from->shape_);
    this->shape_ = this_01;
  }
  else {
    this->shape_ = (BlobShape *)0x0;
  }
  return;
}

Assistant:

ParameterParameter::ParameterParameter(const ParameterParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_shape()) {
    shape_ = new ::caffe::BlobShape(*from.shape_);
  } else {
    shape_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:caffe.ParameterParameter)
}